

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmDefault::gen_code(CTPNStmDefault *this,int param_2,int param_3)

{
  CTPNStmSwitch *pCVar1;
  CTPNStm *substm;
  ulong uVar2;
  size_t len;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  ulong jump_ofs;
  char buf [2];
  ulong slot_ofs;
  char *in_stack_ffffffffffffffe0;
  
  pCVar1 = CTcCodeStream::get_switch(G_cs);
  if (pCVar1 == (CTPNStmSwitch *)0x0) {
    CTcTokenizer::throw_internal_error(0x3aa4);
  }
  pCVar1 = CTcCodeStream::get_switch(G_cs);
  substm = (CTPNStm *)CTPNStmSwitch::get_default_slot(pCVar1);
  uVar2 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  len = uVar2 - (long)substm;
  ::oswp2(&stack0xffffffffffffffe6,(uint)len);
  CTcDataStream::write_at
            ((CTcDataStream *)CONCAT44(in_ESI,in_EDX),(ulong)substm,in_stack_ffffffffffffffe0,len);
  CTcGenTarg::clear_peephole(G_cg);
  if (*(long *)(in_RDI + 0x20) != 0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),substm);
  }
  return;
}

Assistant:

void CTPNStmDefault::gen_code(int, int)
{
    ulong slot_ofs;
    char buf[VMB_UINT2];
    ulong jump_ofs;

    /* 
     *   we must have an active 'switch' statement -- if we don't, we have
     *   an internal error of some kind, because we should never have
     *   gotten this far 
     */
    if (G_cs->get_switch() == 0)
        G_tok->throw_internal_error(TCERR_GEN_BAD_CASE);

    /* ask the switch where our slot goes */
    slot_ofs = G_cs->get_switch()->get_default_slot();

    /*
     *   Set the jump offset.  This is the offset from our slot entry in
     *   the case table to the current output offset.  
     */
    jump_ofs = G_cs->get_ofs() - slot_ofs;
    oswp2(buf, (int)jump_ofs);

    /* write our slot entry to the case table */
    G_cs->write_at(slot_ofs, buf, VMB_UINT2);

    /* 
     *   because we can jump here (via the case table), we cannot allow
     *   peephole optimizations from past instructions - clear the
     *   peephole 
     */
    G_cg->clear_peephole();

    /* generate our substatement, if we have one */
    if (stm_ != 0)
        gen_code_substm(stm_);
}